

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

TEdge * __thiscall
ClipperLib::ClipperBase::ProcessBound(ClipperBase *this,TEdge *E,bool NextIsForward)

{
  bool bVar1;
  bool local_62;
  bool local_61;
  TEdge *local_58;
  TEdge *EStart;
  value_type locMin;
  TEdge *Horz;
  TEdge *Result;
  TEdge *pTStack_20;
  bool NextIsForward_local;
  TEdge *E_local;
  ClipperBase *this_local;
  
  locMin.RightBound = (TEdge *)0x0;
  pTStack_20 = E;
  if (E->OutIdx == -2) {
    if (NextIsForward) {
      for (; (pTStack_20->Top).Y == (pTStack_20->Next->Bot).Y; pTStack_20 = pTStack_20->Next) {
      }
      while( true ) {
        local_61 = false;
        if (pTStack_20 != E) {
          local_61 = IsHorizontal(pTStack_20);
        }
        if (local_61 == false) break;
        pTStack_20 = pTStack_20->Prev;
      }
    }
    else {
      for (; (pTStack_20->Top).Y == (pTStack_20->Prev->Bot).Y; pTStack_20 = pTStack_20->Prev) {
      }
      while( true ) {
        local_62 = false;
        if (pTStack_20 != E) {
          local_62 = IsHorizontal(pTStack_20);
        }
        if (local_62 == false) break;
        pTStack_20 = pTStack_20->Next;
      }
    }
    if (pTStack_20 == E) {
      if (NextIsForward) {
        Horz = pTStack_20->Next;
      }
      else {
        Horz = pTStack_20->Prev;
      }
    }
    else {
      if (NextIsForward) {
        pTStack_20 = E->Next;
      }
      else {
        pTStack_20 = E->Prev;
      }
      EStart = (TEdge *)(pTStack_20->Bot).Y;
      locMin.Y = 0;
      locMin.LeftBound = pTStack_20;
      pTStack_20->WindDelta = 0;
      Horz = ProcessBound(this,pTStack_20,NextIsForward);
      std::vector<ClipperLib::LocalMinimum,_std::allocator<ClipperLib::LocalMinimum>_>::push_back
                (&this->m_MinimaList,(value_type *)&EStart);
    }
    this_local = (ClipperBase *)Horz;
  }
  else {
    bVar1 = IsHorizontal(E);
    if (bVar1) {
      if (NextIsForward) {
        local_58 = E->Prev;
      }
      else {
        local_58 = E->Next;
      }
      bVar1 = IsHorizontal(local_58);
      if (bVar1) {
        if (((local_58->Bot).X != (E->Bot).X) && ((local_58->Top).X != (E->Bot).X)) {
          ReverseHorizontal(E);
        }
      }
      else if ((local_58->Bot).X != (E->Bot).X) {
        ReverseHorizontal(E);
      }
    }
    Horz = E;
    if (NextIsForward) {
      while( true ) {
        bVar1 = false;
        if ((Horz->Top).Y == (Horz->Next->Bot).Y) {
          bVar1 = Horz->Next->OutIdx != -2;
        }
        if (!bVar1) break;
        Horz = Horz->Next;
      }
      bVar1 = IsHorizontal(Horz);
      if ((bVar1) && (Horz->Next->OutIdx != -2)) {
        locMin.RightBound = Horz;
        while (bVar1 = IsHorizontal((locMin.RightBound)->Prev), bVar1) {
          locMin.RightBound = (locMin.RightBound)->Prev;
        }
        if ((Horz->Next->Top).X < ((locMin.RightBound)->Prev->Top).X) {
          Horz = (locMin.RightBound)->Prev;
        }
      }
      for (; pTStack_20 != Horz; pTStack_20 = pTStack_20->Next) {
        pTStack_20->NextInLML = pTStack_20->Next;
        bVar1 = IsHorizontal(pTStack_20);
        if (((bVar1) && (pTStack_20 != E)) && ((pTStack_20->Bot).X != (pTStack_20->Prev->Top).X)) {
          ReverseHorizontal(pTStack_20);
        }
      }
      bVar1 = IsHorizontal(pTStack_20);
      if (((bVar1) && (pTStack_20 != E)) && ((pTStack_20->Bot).X != (pTStack_20->Prev->Top).X)) {
        ReverseHorizontal(pTStack_20);
      }
      Horz = Horz->Next;
    }
    else {
      while( true ) {
        bVar1 = false;
        if ((Horz->Top).Y == (Horz->Prev->Bot).Y) {
          bVar1 = Horz->Prev->OutIdx != -2;
        }
        if (!bVar1) break;
        Horz = Horz->Prev;
      }
      bVar1 = IsHorizontal(Horz);
      if ((bVar1) && (Horz->Prev->OutIdx != -2)) {
        locMin.RightBound = Horz;
        while (bVar1 = IsHorizontal((locMin.RightBound)->Next), bVar1) {
          locMin.RightBound = (locMin.RightBound)->Next;
        }
        if ((((locMin.RightBound)->Next->Top).X == (Horz->Prev->Top).X) ||
           ((Horz->Prev->Top).X < ((locMin.RightBound)->Next->Top).X)) {
          Horz = (locMin.RightBound)->Next;
        }
      }
      for (; pTStack_20 != Horz; pTStack_20 = pTStack_20->Prev) {
        pTStack_20->NextInLML = pTStack_20->Prev;
        bVar1 = IsHorizontal(pTStack_20);
        if (((bVar1) && (pTStack_20 != E)) && ((pTStack_20->Bot).X != (pTStack_20->Next->Top).X)) {
          ReverseHorizontal(pTStack_20);
        }
      }
      bVar1 = IsHorizontal(pTStack_20);
      if (((bVar1) && (pTStack_20 != E)) && ((pTStack_20->Bot).X != (pTStack_20->Next->Top).X)) {
        ReverseHorizontal(pTStack_20);
      }
      Horz = Horz->Prev;
    }
    this_local = (ClipperBase *)Horz;
  }
  return (TEdge *)this_local;
}

Assistant:

TEdge* ClipperBase::ProcessBound(TEdge* E, bool NextIsForward)
{
  TEdge *Result = E;
  TEdge *Horz = 0;

  if (E->OutIdx == Skip)
  {
    //if edges still remain in the current bound beyond the skip edge then
    //create another LocMin and call ProcessBound once more
    if (NextIsForward)
    {
      while (E->Top.Y == E->Next->Bot.Y) E = E->Next;
      //don't include top horizontals when parsing a bound a second time,
      //they will be contained in the opposite bound ...
      while (E != Result && IsHorizontal(*E)) E = E->Prev;
    }
    else
    {
      while (E->Top.Y == E->Prev->Bot.Y) E = E->Prev;
      while (E != Result && IsHorizontal(*E)) E = E->Next;
    }

    if (E == Result)
    {
      if (NextIsForward) Result = E->Next;
      else Result = E->Prev;
    }
    else
    {
      //there are more edges in the bound beyond result starting with E
      if (NextIsForward)
        E = Result->Next;
      else
        E = Result->Prev;
      MinimaList::value_type locMin;
      locMin.Y = E->Bot.Y;
      locMin.LeftBound = 0;
      locMin.RightBound = E;
      E->WindDelta = 0;
      Result = ProcessBound(E, NextIsForward);
      m_MinimaList.push_back(locMin);
    }
    return Result;
  }

  TEdge *EStart;

  if (IsHorizontal(*E))
  {
    //We need to be careful with open paths because this may not be a
    //true local minima (ie E may be following a skip edge).
    //Also, consecutive horz. edges may start heading left before going right.
    if (NextIsForward) 
      EStart = E->Prev;
    else 
      EStart = E->Next;
    if (IsHorizontal(*EStart)) //ie an adjoining horizontal skip edge
      {
        if (EStart->Bot.X != E->Bot.X && EStart->Top.X != E->Bot.X)
          ReverseHorizontal(*E);
      }
      else if (EStart->Bot.X != E->Bot.X)
        ReverseHorizontal(*E);
  }
  
  EStart = E;
  if (NextIsForward)
  {
    while (Result->Top.Y == Result->Next->Bot.Y && Result->Next->OutIdx != Skip)
      Result = Result->Next;
    if (IsHorizontal(*Result) && Result->Next->OutIdx != Skip)
    {
      //nb: at the top of a bound, horizontals are added to the bound
      //only when the preceding edge attaches to the horizontal's left vertex
      //unless a Skip edge is encountered when that becomes the top divide
      Horz = Result;
      while (IsHorizontal(*Horz->Prev)) Horz = Horz->Prev;
      if (Horz->Prev->Top.X > Result->Next->Top.X) Result = Horz->Prev;
    }
    while (E != Result) 
    {
      E->NextInLML = E->Next;
      if (IsHorizontal(*E) && E != EStart &&
        E->Bot.X != E->Prev->Top.X) ReverseHorizontal(*E);
      E = E->Next;
    }
    if (IsHorizontal(*E) && E != EStart && E->Bot.X != E->Prev->Top.X) 
      ReverseHorizontal(*E);
    Result = Result->Next; //move to the edge just beyond current bound
  } else
  {
    while (Result->Top.Y == Result->Prev->Bot.Y && Result->Prev->OutIdx != Skip) 
      Result = Result->Prev;
    if (IsHorizontal(*Result) && Result->Prev->OutIdx != Skip)
    {
      Horz = Result;
      while (IsHorizontal(*Horz->Next)) Horz = Horz->Next;
      if (Horz->Next->Top.X == Result->Prev->Top.X ||
          Horz->Next->Top.X > Result->Prev->Top.X) Result = Horz->Next;
    }

    while (E != Result)
    {
      E->NextInLML = E->Prev;
      if (IsHorizontal(*E) && E != EStart && E->Bot.X != E->Next->Top.X) 
        ReverseHorizontal(*E);
      E = E->Prev;
    }
    if (IsHorizontal(*E) && E != EStart && E->Bot.X != E->Next->Top.X) 
      ReverseHorizontal(*E);
    Result = Result->Prev; //move to the edge just beyond current bound
  }

  return Result;
}